

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean_test.cc
# Opt level: O3

Test * anon_unknown.dwarf_9eb85::CleanTestCleanRspFile::Create(void)

{
  __node_base_ptr *pp_Var1;
  size_t *psVar2;
  StateTestWithBuiltinRules *this;
  _Rb_tree_header *p_Var3;
  
  this = (StateTestWithBuiltinRules *)operator_new(0x210);
  StateTestWithBuiltinRules::StateTestWithBuiltinRules(this);
  this[1].super_Test._vptr_Test = (_func_int **)&PTR__VirtualFileSystem_001fd238;
  pp_Var1 = &this[1].state_.paths_._M_h._M_single_bucket;
  *(undefined4 *)&this[1].state_.paths_._M_h._M_single_bucket = 0;
  *(undefined8 *)&this[1].state_.pools_._M_t._M_impl = 0;
  this[1].super_Test.failed_ = false;
  *(undefined3 *)&this[1].super_Test.field_0x9 = 0;
  this[1].super_Test.assertion_failures_ = 0;
  this[1].state_.paths_._M_h._M_buckets = (__buckets_ptr)0x0;
  this[1].state_.paths_._M_h._M_bucket_count = 0;
  this[1].state_.paths_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  this[1].state_.paths_._M_h._M_element_count = 0;
  *(undefined8 *)&this[1].state_.paths_._M_h._M_rehash_policy = 0;
  *(__node_base_ptr **)&this[1].state_.pools_._M_t._M_impl.super__Rb_tree_header._M_header = pp_Var1
  ;
  this[1].state_.pools_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pp_Var1;
  this[1].state_.pools_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  psVar2 = &this[1].state_.pools_._M_t._M_impl.super__Rb_tree_header._M_node_count;
  *(undefined4 *)&this[1].state_.pools_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this[1].state_.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this[1].state_.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)psVar2;
  this[1].state_.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)psVar2;
  this[1].state_.bindings_.super_Env._vptr_Env = (_func_int **)0x0;
  p_Var3 = &this[1].state_.bindings_.bindings_._M_t._M_impl.super__Rb_tree_header;
  this[1].state_.bindings_.bindings_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&this[1].state_.bindings_.bindings_._M_t._M_impl.super__Rb_tree_header._M_header + 8) =
       (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&this[1].state_.bindings_.bindings_._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) =
       p_Var3;
  *(_Rb_tree_header **)
   ((long)&this[1].state_.bindings_.bindings_._M_t._M_impl.super__Rb_tree_header._M_header + 0x18) =
       p_Var3;
  this[1].state_.bindings_.bindings_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined4 *)&this[1].state_.bindings_.rules_._M_t._M_impl = 1;
  this[1].state_.bindings_.rules_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 2;
  *(undefined1 *)
   ((long)&this[1].state_.bindings_.rules_._M_t._M_impl.super__Rb_tree_header._M_header + 4) = 0;
  *(undefined4 *)
   ((long)&this[1].state_.bindings_.rules_._M_t._M_impl.super__Rb_tree_header._M_header + 8) = 1;
  *(undefined1 *)
   ((long)&this[1].state_.bindings_.rules_._M_t._M_impl.super__Rb_tree_header._M_header + 0xc) = 0;
  *(undefined4 *)
   ((long)&this[1].state_.bindings_.rules_._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) = 1;
  *(_Base_ptr *)
   ((long)&this[1].state_.bindings_.rules_._M_t._M_impl.super__Rb_tree_header._M_header + 0x18) =
       (_Base_ptr)0x8000000000000000;
  (this->super_Test)._vptr_Test = (_func_int **)0x1f8000;
  g_current_test = (Test *)this;
  return &this->super_Test;
}

Assistant:

TEST_F(CleanTest, CleanRspFile) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule cc\n"
"  command = cc $in > $out\n"
"  rspfile = $rspfile\n"
"  rspfile_content=$in\n"
"build out1: cc in1\n"
"  rspfile = cc1.rsp\n"));
  fs_.Create("out1", "");
  fs_.Create("cc1.rsp", "");

  Cleaner cleaner(&state_, config_, &fs_);
  EXPECT_EQ(0, cleaner.CleanAll());
  EXPECT_EQ(2, cleaner.cleaned_files_count());
  EXPECT_EQ(2u, fs_.files_removed_.size());
}